

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O3

int lyd_validate_modules(lyd_node **node,lys_module **modules,int mod_count,int options,...)

{
  char in_AL;
  int iVar1;
  int iVar2;
  lyd_node *plVar3;
  char *format;
  ly_ctx *ctx;
  lyd_difflist **in_R8;
  undefined8 in_R9;
  lyd_difflist **diff;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_108 [32];
  lyd_difflist **local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  va_list ap;
  
  if (in_AL != '\0') {
    local_d8 = in_XMM0_Qa;
    local_c8 = in_XMM1_Qa;
    local_b8 = in_XMM2_Qa;
    local_a8 = in_XMM3_Qa;
    local_98 = in_XMM4_Qa;
    local_88 = in_XMM5_Qa;
    local_78 = in_XMM6_Qa;
    local_68 = in_XMM7_Qa;
  }
  local_e8 = in_R8;
  local_e0 = in_R9;
  if ((modules == (lys_module **)0x0 || node == (lyd_node **)0x0) || mod_count == 0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid arguments (%s()).","lyd_validate_modules");
    return 1;
  }
  ctx = (*modules)->ctx;
  plVar3 = *node;
  if (((uint)options >> 0xc & 1) == 0 && plVar3 != (lyd_node *)0x0) {
    while (plVar3 = plVar3->prev, plVar3->next != (lyd_node *)0x0) {
      *node = plVar3;
    }
  }
  iVar1 = lyp_data_check_options(ctx,options,"lyd_validate_modules");
  iVar2 = 1;
  if (iVar1 != 0) {
    return 1;
  }
  if ((options & 0xfU) == 0 && (options & 0x10000ffU) != 0) {
    format = "%s: options include a forbidden data type.";
    ctx = (ly_ctx *)0x0;
LAB_0016b28c:
    ly_log(ctx,LY_LLERR,LY_EINVAL,format,"lyd_validate_modules");
  }
  else {
    if (((uint)options >> 0x12 & 1) == 0) {
      diff = (lyd_difflist **)0x0;
    }
    else {
      ap[0].overflow_arg_area = local_108;
      ap[0]._0_8_ = &stack0x00000008;
      local_58 = 0x3000000028;
      diff = local_e8;
      if (local_e8 == (lyd_difflist **)0x0) {
        format = "%s: invalid variable parameter (struct lyd_difflist **).";
        goto LAB_0016b28c;
      }
    }
    iVar2 = _lyd_validate(node,*node,ctx,modules,mod_count,diff,options);
  }
  return iVar2;
}

Assistant:

API int
lyd_validate_modules(struct lyd_node **node, const struct lys_module **modules, int mod_count, int options, ...)
{
    struct ly_ctx *ctx;
    struct lyd_difflist **diff = NULL;
    va_list ap;

    if (!node || !modules || !mod_count) {
        LOGARG;
        return EXIT_FAILURE;
    }

    ctx = modules[0]->ctx;

    if (*node && !(options & LYD_OPT_NOSIBLINGS)) {
        /* check that the node is the first sibling */
        while ((*node)->prev->next) {
            *node = (*node)->prev;
        }
    }

    if (lyp_data_check_options(ctx, options, __func__)) {
        return EXIT_FAILURE;
    }

    if ((options & LYD_OPT_TYPEMASK) && !(options & (LYD_OPT_CONFIG | LYD_OPT_GET | LYD_OPT_GETCONFIG | LYD_OPT_EDIT))) {
        LOGERR(NULL, LY_EINVAL, "%s: options include a forbidden data type.", __func__);
        return EXIT_FAILURE;
    }

    if (options & LYD_OPT_VAL_DIFF) {
        va_start(ap, options);
        diff = va_arg(ap, struct lyd_difflist **);
        va_end(ap);
        if (!diff) {
            LOGERR(ctx, LY_EINVAL, "%s: invalid variable parameter (struct lyd_difflist **).", __func__);
            return EXIT_FAILURE;
        }
    }

    return _lyd_validate(node, *node, ctx, modules, mod_count, diff, options);
}